

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QTimeZone *tz)

{
  Data DVar1;
  storage_type *in_RCX;
  ulong *in_RDX;
  QTimeZonePrivate *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QDebugStateSaver saver;
  QDebugStateSaver local_60;
  QArrayData *local_58;
  qsizetype local_50;
  QString *local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_60,(QDebug *)tz);
  pQVar2 = (tz->d).d;
  *(undefined1 *)
   &pQVar2[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QTimeZone(";
  QString::fromUtf8(&local_40,(QString *)0xa,ba);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&(tz->d).d[1].super_QSharedData.ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == '\x01') {
    QTextStream::operator<<((QTextStream *)(tz->d).d,' ');
  }
  if ((*in_RDX & 3) == 0) {
    pQVar2 = (QTimeZonePrivate *)*in_RDX;
    if (pQVar2 == (QTimeZonePrivate *)0x0) {
      local_48 = (QString *)0x0;
      local_50 = 0;
    }
    else {
      QTimeZonePrivate::id(pQVar2);
    }
    ba_03.m_data = in_RCX;
    ba_03.m_size = local_50;
    QString::fromUtf8(&local_40,local_48,ba_03);
    if ((QChar *)local_40.d.ptr == (QChar *)0x0) {
      local_40.d.ptr = L"";
    }
    QDebug::putString((QDebug *)tz,(QChar *)local_40.d.ptr,local_40.d.size);
    if (*(char *)&(tz->d).d[1].super_QSharedData.ref.super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)(tz->d).d,' ');
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((pQVar2 != (QTimeZonePrivate *)0x0) && (local_58 != (QArrayData *)0x0)) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    goto switchD_0035a281_caseD_3;
  }
  switch((int)*in_RDX - 1U & 3) {
  case 0:
    pQVar2 = (tz->d).d;
    ba_00.m_data = (storage_type *)&switchD_0035a281::switchdataD_0058c8a8;
    ba_00.m_size = (qsizetype)"QTimeZone::LocalTime";
    QString::fromUtf8(&local_40,(QString *)0x14,ba_00);
    QTextStream::operator<<((QTextStream *)pQVar2,&local_40);
    break;
  case 1:
    pQVar2 = (tz->d).d;
    ba_01.m_data = (storage_type *)&switchD_0035a281::switchdataD_0058c8a8;
    ba_01.m_size = (qsizetype)"QTimeZone::UTC";
    QString::fromUtf8(&local_40,(QString *)0xe,ba_01);
    QTextStream::operator<<((QTextStream *)pQVar2,&local_40);
    break;
  case 2:
    pQVar2 = (tz->d).d;
    ba_02.m_data = (storage_type *)&switchD_0035a281::switchdataD_0058c8a8;
    ba_02.m_size = (qsizetype)"AheadOfUtcBy";
    QString::fromUtf8(&local_40,(QString *)0xc,ba_02);
    QTextStream::operator<<((QTextStream *)pQVar2,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(tz->d).d[1].super_QSharedData.ref.super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)(tz->d).d,' ');
    }
    QTextStream::operator<<((QTextStream *)(tz->d).d,(int)(*in_RDX >> 2));
    pQVar2 = (tz->d).d;
    if ((char)pQVar2[1].super_QSharedData.ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != '\x01')
    goto switchD_0035a281_caseD_3;
    goto LAB_0035a3a3;
  case 3:
    goto switchD_0035a281_caseD_3;
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (tz->d).d;
  if (*(char *)&pQVar2[1].super_QSharedData.ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != '\0') {
LAB_0035a3a3:
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
switchD_0035a281_caseD_3:
  pQVar2 = (tz->d).d;
  *(undefined1 *)
   &pQVar2[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
  QTextStream::operator<<((QTextStream *)pQVar2,')');
  if (*(char *)&(tz->d).d[1].super_QSharedData.ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == '\x01') {
    QTextStream::operator<<((QTextStream *)(tz->d).d,' ');
  }
  DVar1 = tz->d;
  (tz->d).d = (QTimeZonePrivate *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)DVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QTimeZone &tz)
{
    QDebugStateSaver saver(dbg);
    const auto asIs = [](const char *text) { return text; };
    // TODO Include backend and data version details?
    dbg.nospace() << "QTimeZone(";
    tz.d.serialize(dbg, asIs);
    dbg.nospace() << ')';
    return dbg;
}